

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  TypeID id;
  Variant *pVVar1;
  size_t sVar2;
  BuiltIn BVar3;
  SPIRFunction *pSVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  bool bVar9;
  uint32_t uVar10;
  ExecutionModel EVar11;
  SPIRType *pSVar12;
  SPIRType *pSVar13;
  ulong uVar14;
  SPIRConstant *pSVar15;
  undefined7 extraout_var;
  CompilerError *this_00;
  uint *ts_1;
  ulong uVar16;
  StorageClass storage_00;
  SPIRVariable *ts_2;
  uint32_t uVar17;
  ID IVar18;
  BuiltIn builtin;
  undefined4 local_26c;
  StorageClass local_268;
  uint local_264;
  SPIRType *local_260;
  uint32_t var_mbr_idx;
  undefined4 local_250;
  uint32_t location;
  string *local_248;
  SPIRType *local_240;
  uint32_t local_234;
  undefined8 local_230;
  InterfaceBlockMeta *local_228;
  string var_name;
  uint32_t initializer;
  undefined4 uStack_1f4;
  _func_int *local_1e8 [2];
  uint32_t ptr_type_id;
  undefined4 uStack_1d4;
  uint local_1c8 [4];
  SPIRFunction *local_1b8;
  SmallVector<unsigned_int,_8UL> *local_1b0;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *local_1a8;
  ParsedIR *local_1a0;
  uint32_t locn;
  undefined4 uStack_194;
  undefined1 auStack_190 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  __node_base_ptr *local_178;
  size_t sStack_170;
  size_t local_168;
  __node_base_ptr ap_Stack_160 [4];
  bool *local_140;
  size_t local_138;
  bool local_128 [8];
  uint32_t local_120;
  bool local_11c;
  StorageClass local_108;
  TypedID<(spirv_cross::Types)1> *local_100;
  size_t local_f8;
  TypedID<(spirv_cross::Types)1> local_e8 [8];
  uint *local_c8;
  size_t local_c0;
  uint local_b0 [15];
  TypeID local_74;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_70;
  
  ts_2 = var;
  local_248 = ib_var_ref;
  local_240 = ib_type;
  local_1b8 = Variant::get<spirv_cross::SPIRFunction>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if (meta->strip_array == true) {
    pSVar12 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar12 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar5 = Compiler::is_builtin_variable((Compiler *)this,var);
  builtin = Compiler::get_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  bVar6 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,DecorationBlock);
  if (storage == StorageClassOutput) {
    bVar7 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar7) {
      emit_local_masked_variable(this,var,meta->strip_array);
      return;
    }
LAB_00205231:
    local_26c = 0;
  }
  else {
    if (storage != StorageClassInput) goto LAB_00205231;
    if ((pSVar12->basetype == Struct) &&
       ((((EVar11 = Compiler::get_execution_model((Compiler *)this),
          EVar11 == ExecutionModelTessellationControl &&
          ((this->msl_options).multi_patch_workgroup != false)) ||
         ((EVar11 = Compiler::get_execution_model((Compiler *)this),
          EVar11 == ExecutionModelTessellationEvaluation &&
          ((this->msl_options).raw_buffer_tese_input == true)))) &&
        (bVar7 = Compiler::has_decoration
                           ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation),
        bVar7)))) {
      uVar10 = Compiler::get_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      locn = uVar10;
      pSVar13 = Compiler::get_variable_data_type((Compiler *)this,var);
      ensure_struct_members_valid_vecsizes(this,pSVar13,&locn);
    }
    bVar7 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_26c = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar7) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"PerVertexKHR decoration is not supported in MSL.");
      goto LAB_00205d52;
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  if (pSVar12->basetype != Struct) {
    EVar11 = Compiler::get_execution_model((Compiler *)this);
    if (((((char)local_26c == '\x01' && EVar11 == ExecutionModelTessellationEvaluation) && (bVar5))
        && (meta->strip_array == false)) && (builtin - BuiltInTessLevelOuter < 2)) {
      add_tess_level_input_to_interface_block(this,local_248,local_240,var);
      return;
    }
    if (Char < pSVar12->basetype) {
      return;
    }
    if ((0x8077fcU >> (pSVar12->basetype & (MeshGridProperties|Int)) & 1) == 0) {
      return;
    }
    if ((bVar5) && (bVar6 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), !bVar6))
    {
      return;
    }
    bVar6 = Compiler::is_matrix((Compiler *)this,pSVar12);
    if (bVar6) {
      bVar6 = false;
    }
    else {
      bVar6 = Compiler::is_array((Compiler *)this,pSVar12);
      bVar6 = !bVar6;
    }
    bVar7 = variable_storage_requires_stage_io(this,storage);
    bVar9 = true;
    if ((char)local_26c != '\0') {
      EVar11 = Compiler::get_execution_model((Compiler *)this);
      bVar9 = EVar11 == ExecutionModelFragment;
    }
    if ((!bVar6 && bVar7) && (bVar5 & bVar9 & builtin - BuiltInVertexId < 0xfffffffe) == 0) {
      add_composite_variable_to_interface_block(this,storage,local_248,local_240,var,meta);
      return;
    }
LAB_002053fa:
    add_plain_variable_to_interface_block(this,storage,local_248,local_240,var,meta);
    return;
  }
  bVar7 = variable_storage_requires_stage_io(this,storage);
  if ((!bVar7) && (bVar6)) {
    bVar7 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0;
  }
  bVar8 = 1;
  if ((!bVar5 && bVar7 == true) && (meta->allow_local_declaration == true)) {
    emit_local_masked_variable(this,var,meta->strip_array);
    bVar8 = 0;
  }
  if (bVar7 == false) goto LAB_002053fa;
  location = 0xffffffff;
  var_mbr_idx = 0;
  local_260 = pSVar12;
  bVar5 = Compiler::is_matrix((Compiler *)this,pSVar12);
  pSVar12 = local_260;
  bVar7 = Compiler::is_array((Compiler *)this,local_260);
  if (bVar5) {
    if (bVar7) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"MSL cannot emit arrays-of-matrices in input and output variables.");
LAB_00205d52:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar10 = pSVar12->columns;
  }
  else {
    if (!bVar7) {
      uVar10 = 1;
      goto LAB_00205498;
    }
    if ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size != 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"MSL cannot emit arrays-of-arrays in input and output variables.");
      goto LAB_00205d52;
    }
    uVar10 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar12);
  }
  if (uVar10 == 0) {
    return;
  }
LAB_00205498:
  local_264 = 0;
  local_1a0 = &(this->super_CompilerGLSL).super_Compiler.ir;
  local_1a8 = &local_1b8->local_variables;
  local_1b0 = &this->vars_needing_early_declaration;
  uVar14 = (ulong)(uint)(pSVar12->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
  uVar17 = 0;
  local_230 = 0;
  local_268 = storage;
  local_234 = uVar10;
  local_228 = meta;
  do {
    if ((int)uVar14 != 0) {
      uVar16 = 0;
      do {
        builtin = BuiltInMax;
        uVar10 = (uint32_t)uVar16;
        bVar5 = Compiler::is_member_builtin((Compiler *)this,pSVar12,uVar10,&builtin);
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (pSVar12->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                             [uVar16].id);
        if ((local_268 == StorageClassOutput) &&
           (bVar7 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,uVar10,meta->strip_array), bVar7)) {
          location = 0xffffffff;
          local_230 = CONCAT71((int7)((ulong)local_230 >> 8),(byte)local_230 | bVar6);
          pSVar12 = local_260;
          if ((bVar5) && (meta->strip_array == false)) {
            uVar10 = ParsedIR::increase_bound_by(local_1a0,2);
            ptr_type_id = uVar10;
            SPIRType::SPIRType((SPIRType *)&locn,pSVar13);
            local_11c = true;
            local_120 = local_120 + 1;
            local_74.id = (local_260->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar16]
                          .id;
            local_108 = StorageClassOutput;
            _initializer = _initializer & 0xffffffff00000000;
            uVar14 = (ulong)(var->initializer).id;
            if ((uVar14 != 0) &&
               ((uVar14 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.buffer_size &&
                (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr,
                pVVar1[uVar14].type == TypeConstant)))) {
              pSVar15 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar14);
              initializer = (pSVar15->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar16].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,(SPIRType *)&locn);
            IVar18.id = uVar10 + 1;
            var_name._M_dataplus._M_p._0_4_ = 3;
            ts_2 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,IVar18.id,&ptr_type_id,(StorageClass *)&var_name,
                       (uint *)ts_2);
            pSVar4 = local_1b8;
            SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                      (local_1a8,
                       (local_1b8->local_variables).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size +
                       1);
            sVar2 = (pSVar4->local_variables).
                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
            (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .ptr[sVar2].id = IVar18.id;
            (pSVar4->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
            .buffer_size = sVar2 + 1;
            SmallVector<unsigned_int,_8UL>::reserve
                      (local_1b0,
                       (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                       buffer_size + 1);
            sVar2 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                    buffer_size;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar2] =
                 IVar18.id;
            (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                 sVar2 + 1;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&var_name,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,IVar18,&var_name);
            meta = local_228;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
                &var_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(var_name._M_dataplus._M_p._4_4_,
                                       var_name._M_dataplus._M_p._0_4_));
            }
            Compiler::set_decoration((Compiler *)this,IVar18,DecorationBuiltIn,builtin);
            _locn = &PTR__SPIRType_0035c188;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&local_70);
            local_c0 = 0;
            if (local_c8 != local_b0) {
              free(local_c8);
            }
            pSVar12 = local_260;
            local_f8 = 0;
            if (local_100 != local_e8) {
              free(local_100);
            }
            local_138 = 0;
            if (local_140 != local_128) {
              free(local_140);
            }
            sStack_170 = 0;
            if (local_178 != ap_Stack_160) {
              free(local_178);
            }
          }
        }
        else if ((!bVar5) ||
                (bVar7 = Compiler::has_active_builtin((Compiler *)this,builtin,local_268),
                pSVar12 = local_260, bVar7)) {
          bVar7 = Compiler::is_matrix((Compiler *)this,pSVar13);
          if ((bVar7) || (bVar7 = Compiler::is_array((Compiler *)this,pSVar13), bVar7)) {
            local_250 = 0;
          }
          else {
            local_250 = (undefined4)CONCAT71(extraout_var,pSVar13->basetype != Struct);
          }
          bVar7 = true;
          storage_00 = local_268;
          if ((char)local_26c != '\0') {
            EVar11 = Compiler::get_execution_model((Compiler *)this);
            bVar7 = EVar11 == ExecutionModelFragment;
            storage_00 = StorageClassInput;
          }
          bVar9 = variable_storage_requires_stage_io(this,storage_00);
          BVar3 = builtin;
          ts_1 = (uint *)0x1;
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&var_name,this,(ulong)(var->super_IVariant).self.id);
          _ptr_type_id = (pointer)local_1c8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&ptr_type_id,
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                     var_name._M_string_length +
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
          _initializer = (pointer)local_1e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&initializer,
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_),
                     var_name._M_string_length +
                     CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_));
          if (local_234 != 1) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&locn,(spirv_cross *)0x2beef5,(char (*) [2])&local_264,ts_1);
            ::std::__cxx11::string::_M_append((char *)&ptr_type_id,(ulong)_locn);
            if ((TypedID<(spirv_cross::Types)0> *)_locn !=
                (TypedID<(spirv_cross::Types)0> *)(auStack_190 + 8)) {
              operator_delete(_locn);
            }
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&locn,(spirv_cross *)0x2be9ba,(char (*) [2])&local_264,
                       (uint *)0x2be8bf,(char (*) [2])ts_2);
            ::std::__cxx11::string::_M_append((char *)&initializer,(ulong)_locn);
            if ((TypedID<(spirv_cross::Types)0> *)_locn !=
                (TypedID<(spirv_cross::Types)0> *)(auStack_190 + 8)) {
              operator_delete(_locn);
            }
          }
          meta = local_228;
          pSVar12 = local_260;
          if (((~bVar9 | (byte)local_250) & 1) == 0 &&
              (bVar5 & bVar7 & BVar3 - BuiltInVertexId < 0xfffffffe) == 0) {
            _locn = (undefined **)0x0;
            auStack_190 = (undefined1  [8])ap_Stack_160;
            local_188._M_allocated_capacity = 1;
            local_188._M_local_buf[8] = '\0';
            local_188._M_local_buf[9] = '\0';
            local_188._M_local_buf[10] = '\0';
            local_188._M_local_buf[0xb] = '\0';
            local_188._M_local_buf[0xc] = '\0';
            local_188._M_local_buf[0xd] = '\0';
            local_188._M_local_buf[0xe] = '\0';
            local_188._M_local_buf[0xf] = '\0';
            local_178 = (__node_base_ptr *)0x0;
            sStack_170 = 0x3f800000;
            local_168 = 0;
            ap_Stack_160[0] = (__node_base_ptr)0x0;
            ts_2 = var;
            add_composite_member_variable_to_interface_block
                      (this,local_268,local_248,local_240,var,local_260,uVar10,local_228,
                       (string *)&ptr_type_id,(string *)&initializer,&location,&var_mbr_idx,
                       (Bitset *)&locn);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)auStack_190);
          }
          else {
            ts_2 = var;
            add_plain_member_variable_to_interface_block
                      (this,local_268,local_248,local_240,var,local_260,uVar10,local_228,
                       (string *)&ptr_type_id,(string *)&initializer,&location,&var_mbr_idx);
          }
          if ((_func_int **)_initializer != local_1e8) {
            operator_delete(_initializer);
          }
          if ((uint *)_ptr_type_id != local_1c8) {
            operator_delete(_ptr_type_id);
          }
          uVar17 = var_mbr_idx;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_) !=
              &var_name.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(var_name._M_dataplus._M_p._4_4_,var_name._M_dataplus._M_p._0_4_
                                    ));
            uVar17 = var_mbr_idx;
          }
        }
        uVar17 = uVar17 + 1;
        uVar16 = uVar16 + 1;
        uVar14 = (ulong)(uint)(pSVar12->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                              buffer_size;
        uVar10 = local_234;
        var_mbr_idx = uVar17;
      } while (uVar16 < uVar14);
    }
    local_264 = local_264 + 1;
  } while (local_264 < uVar10);
  if (((bVar8 & (byte)local_230) != 0) &&
     ((bVar5 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar5 ||
      (EVar11 = Compiler::get_execution_model((Compiler *)this),
      EVar11 == ExecutionModelTessellationControl)))) {
    bVar5 = Compiler::is_builtin_variable((Compiler *)this,var);
    if (bVar5) {
      if ((int)(pSVar12->member_types).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size != 0) {
        uVar10 = 0;
        do {
          id.id = (pSVar12->super_IVariant).self.id;
          uVar17 = Compiler::get_member_decoration((Compiler *)this,id,uVar10,DecorationBuiltIn);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    ((string *)&locn,this,(ulong)uVar17,3);
          Compiler::set_member_name((Compiler *)this,id,uVar10,(string *)&locn);
          if ((TypedID<(spirv_cross::Types)0> *)_locn !=
              (TypedID<(spirv_cross::Types)0> *)(auStack_190 + 8)) {
            operator_delete(_locn);
          }
          uVar10 = uVar10 + 1;
          pSVar12 = local_260;
        } while (uVar10 < (uint)(local_260->member_types).
                                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                buffer_size);
      }
      IVar18.id = (pSVar12->super_IVariant).self.id;
      _locn = (undefined **)(auStack_190 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&locn,"gl_PerVertex","");
      Compiler::set_name((Compiler *)this,IVar18,(string *)&locn);
      if ((TypedID<(spirv_cross::Types)0> *)_locn !=
          (TypedID<(spirv_cross::Types)0> *)(auStack_190 + 8)) {
        operator_delete(_locn);
      }
      IVar18.id = (var->super_IVariant).self.id;
      _locn = (undefined **)(auStack_190 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&locn,"gl_out_masked","");
      Compiler::set_name((Compiler *)this,IVar18,(string *)&locn);
      if ((TypedID<(spirv_cross::Types)0> *)_locn !=
          (TypedID<(spirv_cross::Types)0> *)(auStack_190 + 8)) {
        operator_delete(_locn);
      }
      (this->stage_out_masked_builtin_type_id).id = (pSVar12->super_IVariant).self.id;
    }
    emit_local_masked_variable(this,var,meta->strip_array);
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	// Tesselation stages pass I/O via buffer content which may contain nested structs.
	// Ensure the vector sizes of any nested struct members within these input variables match
	// the vector sizes of the corresponding output variables from the previous pipeline stage.
	// This adjustment is handled here instead of ensure_correct_input_type() in order to
	// perform the necessary recursive processing.
	if (storage == StorageClassInput && var_type.basetype == SPIRType::Struct &&
		((is_tesc_shader() && msl_options.multi_patch_workgroup) ||
		 (is_tese_shader() && msl_options.raw_buffer_tese_input)) &&
		has_decoration(var.self, DecorationLocation))
	{
		uint32_t locn = get_decoration(var.self, DecorationLocation);
		ensure_struct_members_valid_vecsizes(get_variable_data_type(var), locn);
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx, {});
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}